

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doPrintValue
               (FloatFormat *fmt,Matrix<float,_4,_4> *value,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  int ndx;
  long lVar3;
  
  pcVar1 = dataTypeNameOf<tcu::Matrix<float,4,4>>();
  poVar2 = std::operator<<(os,pcVar1);
  std::operator<<(poVar2,"(");
  lVar3 = 0;
  do {
    if (lVar3 != 0) {
      if (lVar3 == 4) {
        std::operator<<(os,")");
        return;
      }
      std::operator<<(os,", ");
    }
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doPrintValue
              (fmt,(Vector<float,_4> *)value,os);
    lVar3 = lVar3 + 1;
    value = (Matrix<float,_4,_4> *)((long)value + 0x10);
  } while( true );
}

Assistant:

static void			doPrintValue	(const FloatFormat& fmt, const T& value, ostream& os)
	{
		os << dataTypeNameOf<T>() << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printValue<Element>(fmt, value[ndx], os);
		}

		os << ")";
	}